

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_traits.hpp
# Opt level: O3

bool __thiscall
jsoncons::typed_array_visitor<std::vector<float,_std::allocator<float>_>_>::visit_begin_array
          (typed_array_visitor<std::vector<float,_std::allocator<float>_>_> *this,size_t size,
          semantic_tag param_2,ser_context *param_3,error_code *ec)

{
  int iVar1;
  
  iVar1 = this->level_;
  this->level_ = iVar1 + 1;
  if (iVar1 == 0) {
    if (size != 0) {
      std::vector<float,_std::allocator<float>_>::reserve(this->v_,size);
    }
  }
  else {
    std::error_code::operator=(ec,not_vector);
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_begin_array(std::size_t size, 
            semantic_tag, 
            const ser_context&, 
            std::error_code& ec) override
        {
            if (++level_ != 1)
            {
                ec = conv_errc::not_vector;
                JSONCONS_VISITOR_RETURN;
            }
            if (size > 0)
            {
                reserve_storage(typename std::integral_constant<bool, ext_traits::has_reserve<T>::value>::type(), v_, size);
            }
            JSONCONS_VISITOR_RETURN;
        }